

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_context_output(jx9_context *pCtx,char *zString,int nLen)

{
  sxi32 sVar1;
  undefined1 auStack_30 [4];
  int rc;
  SyString sData;
  int nLen_local;
  char *zString_local;
  jx9_context *pCtx_local;
  
  sData._12_4_ = nLen;
  if (nLen < 0) {
    sData._12_4_ = SyStrlen(zString);
  }
  sData.zString._0_4_ = sData._12_4_;
  _auStack_30 = zString;
  sVar1 = jx9VmOutputConsume(pCtx->pVm,(SyString *)auStack_30);
  return sVar1;
}

Assistant:

JX9_PRIVATE int jx9_context_output(jx9_context *pCtx, const char *zString, int nLen)
{
	SyString sData;
	int rc;
	if( nLen < 0 ){
		nLen = (int)SyStrlen(zString);
	}
	SyStringInitFromBuf(&sData, zString, nLen);
	rc = jx9VmOutputConsume(pCtx->pVm, &sData);
	return rc;
}